

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

char * clib_check_lds(lua_State *L,char *buf)

{
  char *pcVar1;
  int iVar2;
  GCstr *pGVar3;
  char *in_RSI;
  bool bVar4;
  char *unaff_retaddr;
  lua_State *in_stack_00000008;
  char *e;
  char *p;
  char *local_28;
  char *local_20;
  size_t in_stack_fffffffffffffff8;
  
  iVar2 = strncmp(in_RSI,"GROUP",5);
  if (((iVar2 == 0) || (iVar2 = strncmp(in_RSI,"INPUT",5), iVar2 == 0)) &&
     (local_20 = strchr(in_RSI,0x28), local_20 != (char *)0x0)) {
    do {
      local_28 = local_20 + 1;
      pcVar1 = local_20 + 1;
      local_20 = local_28;
    } while (*pcVar1 == ' ');
    while( true ) {
      bVar4 = false;
      if ((*local_28 != '\0') && (bVar4 = false, *local_28 != ' ')) {
        bVar4 = *local_28 != ')';
      }
      if (!bVar4) break;
      local_28 = local_28 + 1;
    }
    pGVar3 = lj_str_new(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    pGVar3 = pGVar3 + 1;
  }
  else {
    pGVar3 = (GCstr *)0x0;
  }
  return (char *)pGVar3;
}

Assistant:

static const char *clib_check_lds(lua_State *L, const char *buf)
{
  char *p, *e;
  if ((!strncmp(buf, "GROUP", 5) || !strncmp(buf, "INPUT", 5)) &&
      (p = strchr(buf, '('))) {
    while (*++p == ' ') ;
    for (e = p; *e && *e != ' ' && *e != ')'; e++) ;
    return strdata(lj_str_new(L, p, e-p));
  }
  return NULL;
}